

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O1

WebPMuxError WebPMuxAssemble(WebPMux *mux,WebPData *assembled_data)

{
  byte *pbVar1;
  WebPMuxError WVar2;
  int iVar3;
  WebPMuxImage *pWVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uint8_t *data;
  uint8_t *puVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  WebPMuxImage *pWVar17;
  uint uVar18;
  uint uVar19;
  WebPMuxError WVar20;
  byte bVar21;
  int iVar22;
  bool bVar23;
  int num_frames;
  int num_anim_chunks;
  uint local_64;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  WebPMuxImage *local_58;
  size_t local_50;
  WebPData local_48;
  uint local_38;
  uint32_t local_34;
  
  if (assembled_data == (WebPData *)0x0) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  assembled_data->bytes = (uint8_t *)0x0;
  assembled_data->size = 0;
  if (mux == (WebPMux *)0x0) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  WVar2 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANMF,(int *)&local_64);
  if (WVar2 == WEBP_MUX_OK) {
    if (local_64 == 1) {
      local_48.bytes = (uint8_t *)0x0;
      WVar2 = MuxImageGetNth(&mux->images_,1,(WebPMuxImage **)&local_48);
      if (WVar2 != WEBP_MUX_OK) goto LAB_0014e838;
      if ((*(WebPChunk **)local_48.bytes != (WebPChunk *)0x0) &&
         (((mux->canvas_width_ == 0 && (mux->canvas_height_ == 0)) ||
          ((*(int *)(local_48.bytes + 0x20) == mux->canvas_width_ &&
           (*(int *)(local_48.bytes + 0x24) == mux->canvas_height_)))))) {
        ChunkDelete(*(WebPChunk **)local_48.bytes);
        local_48.bytes[0] = '\0';
        local_48.bytes[1] = '\0';
        local_48.bytes[2] = '\0';
        local_48.bytes[3] = '\0';
        local_48.bytes[4] = '\0';
        local_48.bytes[5] = '\0';
        local_48.bytes[6] = '\0';
        local_48.bytes[7] = '\0';
        local_64 = 0;
      }
    }
    WVar2 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANIM,(int *)&local_48);
    if ((WVar2 == WEBP_MUX_OK) &&
       ((((int)local_48.bytes < 1 || (local_64 != 0)) ||
        (WVar2 = MuxDeleteAllNamedData(mux,0x4d494e41), WVar2 == WEBP_MUX_OK)))) {
      WVar2 = WEBP_MUX_OK;
    }
  }
LAB_0014e838:
  if (WVar2 != WEBP_MUX_OK) {
    return WVar2;
  }
  local_48.size = 10;
  pWVar17 = mux->images_;
  local_48.bytes = (uint8_t *)&local_64;
  if (((pWVar17 == (WebPMuxImage *)0x0) || (pWVar17->img_ == (WebPChunk *)0x0)) ||
     ((pWVar17->img_->data_).bytes == (uint8_t *)0x0)) goto LAB_0014ea51;
  local_58 = pWVar17;
  WVar2 = MuxDeleteAllNamedData(mux,0x58385056);
  if (1 < (uint)WVar2) goto LAB_0014ea57;
  uVar13 = 0;
  if (mux->iccp_ != (WebPChunk *)0x0) {
    uVar13 = (uint)((mux->iccp_->data_).bytes != (uint8_t *)0x0) << 5;
  }
  if ((mux->exif_ != (WebPChunk *)0x0) && ((mux->exif_->data_).bytes != (uint8_t *)0x0)) {
    uVar13 = uVar13 | 8;
  }
  if ((mux->xmp_ != (WebPChunk *)0x0) && ((mux->xmp_->data_).bytes != (uint8_t *)0x0)) {
    uVar13 = uVar13 | 4;
  }
  if ((local_58->header_ != (WebPChunk *)0x0) && (local_58->header_->tag_ == 0x464d4e41)) {
    uVar13 = uVar13 | 2;
  }
  iVar3 = MuxImageCount(local_58,WEBP_CHUNK_ALPHA);
  pWVar17 = local_58;
  uVar10 = uVar13 | 0x10;
  if (0 < iVar3) {
    uVar13 = uVar10;
  }
  pWVar4 = mux->images_;
  local_50 = CONCAT44(local_50._4_4_,uVar13);
  if (pWVar4->next_ == (WebPMuxImage *)0x0) {
    iVar3 = pWVar4->width_;
    iVar14 = pWVar4->height_;
    WVar2 = WEBP_MUX_OK;
  }
  else {
    bVar23 = pWVar4 == (WebPMuxImage *)0x0;
    if (bVar23) {
      iVar3 = 0;
      WVar2 = WEBP_MUX_OK;
      iVar14 = 0;
    }
    else {
      local_34 = 0x58385056;
      iVar11 = 0;
      iVar12 = 0;
      do {
        sVar5 = (pWVar4->header_->data_).size;
        WVar20 = WEBP_MUX_INVALID_ARGUMENT;
        uVar18 = 0;
        uVar19 = 0;
        if (sVar5 == 0x10) {
          pbVar1 = (pWVar4->header_->data_).bytes;
          uVar18 = (uint)pbVar1[1] * 0x200 + (uint)*pbVar1 * 2 | (uint)pbVar1[2] << 0x11;
          uVar19 = (uint)pbVar1[4] * 0x200 + (uint)pbVar1[3] * 2 | (uint)pbVar1[5] << 0x11;
          WVar20 = WEBP_MUX_OK;
        }
        iVar3 = 0;
        iVar22 = 0;
        iVar16 = 0;
        if (sVar5 == 0x10) {
          iVar22 = pWVar4->width_;
          iVar16 = pWVar4->height_;
          WVar20 = WEBP_MUX_OK;
        }
        iVar14 = 0;
        if (WVar20 != WEBP_MUX_OK) break;
        if (iVar11 < (int)(iVar22 + uVar18)) {
          iVar11 = iVar22 + uVar18;
        }
        if (iVar12 < (int)(iVar16 + uVar19)) {
          iVar12 = iVar16 + uVar19;
        }
        pWVar4 = pWVar4->next_;
        bVar23 = pWVar4 == (WebPMuxImage *)0x0;
        iVar3 = iVar11;
        iVar14 = iVar12;
        WVar20 = WVar2;
      } while (!bVar23);
      WVar2 = WVar20;
      local_38 = uVar10;
      if (bVar23) {
        WVar2 = WEBP_MUX_OK;
      }
    }
  }
  if (WVar2 != WEBP_MUX_OK) goto LAB_0014ea57;
  if ((((iVar3 < 1) || (iVar14 < 1)) || (0x1000000 < iVar3)) || (0x1000000 < iVar14)) {
LAB_0014ea51:
    WVar2 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else {
    iVar11 = mux->canvas_width_;
    if ((iVar11 != 0) || (mux->canvas_height_ != 0)) {
      if (iVar11 < iVar3) goto LAB_0014ea51;
      WVar2 = WEBP_MUX_INVALID_ARGUMENT;
      bVar23 = mux->canvas_height_ < iVar14;
      iVar3 = iVar11;
      iVar14 = mux->canvas_height_;
      if (bVar23) goto LAB_0014ea57;
    }
    if ((uVar13 == 0) && (mux->unknown_ == (WebPChunk *)0x0)) {
      WVar2 = WEBP_MUX_OK;
    }
    else {
      local_58 = (WebPMuxImage *)CONCAT44(local_58._4_4_,iVar3);
      iVar3 = MuxHasAlpha(pWVar17);
      bVar21 = (byte)uVar10;
      if (iVar3 == 0) {
        bVar21 = (byte)uVar13;
      }
      local_64 = (uint)bVar21;
      iVar3 = (int)local_58 + -1;
      local_60 = (undefined1)iVar3;
      local_5f = (undefined1)((uint)iVar3 >> 8);
      local_5e = (undefined1)((uint)iVar3 >> 0x10);
      iVar14 = iVar14 + -1;
      local_5d = (undefined1)iVar14;
      local_5c = (undefined1)((uint)iVar14 >> 8);
      local_5b = (undefined1)((uint)iVar14 >> 0x10);
      WVar2 = MuxSet(mux,0x58385056,&local_48,1);
    }
  }
LAB_0014ea57:
  if (WVar2 == WEBP_MUX_OK) {
    sVar5 = ChunkListDiskSize(mux->vp8x_);
    local_58 = (WebPMuxImage *)ChunkListDiskSize(mux->iccp_);
    local_50 = ChunkListDiskSize(mux->anim_);
    lVar15 = 0;
    for (pWVar17 = mux->images_; pWVar17 != (WebPMuxImage *)0x0; pWVar17 = pWVar17->next_) {
      sVar6 = MuxImageDiskSize(pWVar17);
      lVar15 = lVar15 + sVar6;
    }
    sVar6 = ChunkListDiskSize(mux->exif_);
    sVar7 = ChunkListDiskSize(mux->xmp_);
    sVar8 = ChunkListDiskSize(mux->unknown_);
    sVar5 = sVar5 + (long)local_58 + local_50 + lVar15 + sVar6 + sVar7 + sVar8 + 0xc;
    data = (uint8_t *)WebPSafeMalloc(1,sVar5);
    if (data == (uint8_t *)0x0) {
      WVar2 = WEBP_MUX_MEMORY_ERROR;
    }
    else {
      puVar9 = MuxEmitRiffHeader(data,sVar5);
      puVar9 = ChunkListEmit(mux->vp8x_,puVar9);
      puVar9 = ChunkListEmit(mux->iccp_,puVar9);
      puVar9 = ChunkListEmit(mux->anim_,puVar9);
      for (pWVar17 = mux->images_; pWVar17 != (WebPMuxImage *)0x0; pWVar17 = pWVar17->next_) {
        puVar9 = MuxImageEmit(pWVar17,puVar9);
      }
      puVar9 = ChunkListEmit(mux->exif_,puVar9);
      puVar9 = ChunkListEmit(mux->xmp_,puVar9);
      ChunkListEmit(mux->unknown_,puVar9);
      WVar2 = MuxValidate(mux);
      if (WVar2 != WEBP_MUX_OK) {
        WebPSafeFree(data);
        sVar5 = 0;
        data = (uint8_t *)0x0;
      }
      assembled_data->bytes = data;
      assembled_data->size = sVar5;
    }
  }
  return WVar2;
}

Assistant:

WebPMuxError WebPMuxAssemble(WebPMux* mux, WebPData* assembled_data) {
  size_t size = 0;
  uint8_t* data = NULL;
  uint8_t* dst = NULL;
  WebPMuxError err;

  if (assembled_data == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  // Clean up returned data, in case something goes wrong.
  memset(assembled_data, 0, sizeof(*assembled_data));

  if (mux == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  // Finalize mux.
  err = MuxCleanup(mux);
  if (err != WEBP_MUX_OK) return err;
  err = CreateVP8XChunk(mux);
  if (err != WEBP_MUX_OK) return err;

  // Allocate data.
  size = ChunkListDiskSize(mux->vp8x_) + ChunkListDiskSize(mux->iccp_)
       + ChunkListDiskSize(mux->anim_) + ImageListDiskSize(mux->images_)
       + ChunkListDiskSize(mux->exif_) + ChunkListDiskSize(mux->xmp_)
       + ChunkListDiskSize(mux->unknown_) + RIFF_HEADER_SIZE;

  data = (uint8_t*)WebPSafeMalloc(1ULL, size);
  if (data == NULL) return WEBP_MUX_MEMORY_ERROR;

  // Emit header & chunks.
  dst = MuxEmitRiffHeader(data, size);
  dst = ChunkListEmit(mux->vp8x_, dst);
  dst = ChunkListEmit(mux->iccp_, dst);
  dst = ChunkListEmit(mux->anim_, dst);
  dst = ImageListEmit(mux->images_, dst);
  dst = ChunkListEmit(mux->exif_, dst);
  dst = ChunkListEmit(mux->xmp_, dst);
  dst = ChunkListEmit(mux->unknown_, dst);
  assert(dst == data + size);

  // Validate mux.
  err = MuxValidate(mux);
  if (err != WEBP_MUX_OK) {
    WebPSafeFree(data);
    data = NULL;
    size = 0;
  }

  // Finalize data.
  assembled_data->bytes = data;
  assembled_data->size = size;

  return err;
}